

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmNinjaNormalTargetGenerator::WriteDeviceLinkRule
          (cmNinjaNormalTargetGenerator *this,bool useResponseFile)

{
  cmGeneratorTarget *target;
  cmLocalNinjaGenerator *pcVar1;
  size_type sVar2;
  bool bVar3;
  TargetType TVar4;
  TargetType targetType;
  cmGlobalNinjaGenerator *pcVar5;
  string *psVar6;
  char *pcVar7;
  undefined4 extraout_var;
  ostream *poVar8;
  size_t sVar9;
  pointer *__ptr;
  cmOutputConverter *outputConverter;
  string *linkCmd_1;
  pointer __rhs;
  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
  rulePlaceholderExpander;
  string responseFlag;
  string rspfile;
  string launcher;
  string rspcontent;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkCmds;
  string langFlags;
  string local_528;
  string ruleName;
  string local_4e8;
  string local_4c8;
  string local_4a8;
  string local_488;
  string linkCmd;
  ostringstream comment;
  size_type local_440;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_438 [6];
  ios_base local_3d8 [264];
  RuleVariables vars;
  ostringstream description;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  TVar4 = cmGeneratorTarget::GetType
                    ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                     GeneratorTarget);
  LanguageLinkerDeviceRule_abi_cxx11_(&ruleName,this);
  rspfile._M_dataplus._M_p = (pointer)&rspfile.field_2;
  rspfile._M_string_length = 0;
  rspfile.field_2._M_local_buf[0] = '\0';
  rspcontent._M_dataplus._M_p = (pointer)&rspcontent.field_2;
  rspcontent._M_string_length = 0;
  rspcontent.field_2._M_local_buf[0] = '\0';
  pcVar5 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  bVar3 = cmGlobalNinjaGenerator::HasRule(pcVar5,&ruleName);
  if (!bVar3) {
    cmRulePlaceholderExpander::RuleVariables::RuleVariables(&vars);
    psVar6 = cmGeneratorTarget::GetName_abi_cxx11_
                       ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                        GeneratorTarget);
    vars.CMTargetName = (psVar6->_M_dataplus)._M_p;
    targetType = cmGeneratorTarget::GetType
                           ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                            GeneratorTarget);
    vars.CMTargetType = cmState::GetTargetTypeName(targetType);
    vars.Language = "CUDA";
    responseFlag._M_dataplus._M_p = (pointer)&responseFlag.field_2;
    responseFlag._M_string_length = 0;
    responseFlag.field_2._M_local_buf[0] = '\0';
    if (useResponseFile) {
      _comment = (pointer)local_438;
      std::__cxx11::string::_M_construct<char_const*>((string *)&comment,"CMAKE_","");
      std::__cxx11::string::_M_append
                ((char *)&comment,(ulong)(this->TargetLinkLanguage)._M_dataplus._M_p);
      _description = (pointer)local_198;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&description,_comment,_comment + local_440);
      std::__cxx11::string::append((char *)&description);
      pcVar7 = cmMakefile::GetDefinition
                         ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                          Makefile,(string *)&description);
      sVar2 = responseFlag._M_string_length;
      if (pcVar7 == (char *)0x0) {
        pcVar7 = "@";
      }
      else {
        strlen(pcVar7);
      }
      std::__cxx11::string::_M_replace((ulong)&responseFlag,0,(char *)sVar2,(ulong)pcVar7);
      std::__cxx11::string::_M_replace((ulong)&rspfile,0,(char *)rspfile._M_string_length,0x4cdec9);
      std::__cxx11::string::_M_append((char *)&responseFlag,(ulong)rspfile._M_dataplus._M_p);
      pcVar5 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      pcVar7 = "$in_newline";
      if (pcVar5->UsingGCCOnWindows != false) {
        pcVar7 = "$in";
      }
      std::__cxx11::string::_M_replace
                ((ulong)&rspcontent,0,(char *)rspcontent._M_string_length,(ulong)pcVar7);
      std::__cxx11::string::append((char *)&rspcontent);
      vars.Objects = responseFlag._M_dataplus._M_p;
      vars.LinkLibraries = "";
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_description != local_198) {
        operator_delete(_description,local_198[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_comment != local_438) {
        operator_delete(_comment,CONCAT71(local_438[0]._M_allocated_capacity._1_7_,
                                          local_438[0]._M_local_buf[0]) + 1);
      }
    }
    else {
      vars.Objects = "$in";
      vars.LinkLibraries = "$LINK_PATH $LINK_LIBRARIES";
    }
    vars.ObjectDir = "$OBJECT_DIR";
    vars.Target = "$TARGET_FILE";
    vars.SONameFlag = "$SONAME_FLAG";
    vars.TargetSOName = "$SONAME";
    vars.TargetPDB = "$TARGET_PDB";
    vars.TargetCompilePDB = "$TARGET_COMPILE_PDB";
    vars.Flags = "$FLAGS";
    vars.LinkFlags = "$LINK_FLAGS";
    vars.Manifests = "$MANIFESTS";
    langFlags._M_dataplus._M_p = (pointer)&langFlags.field_2;
    langFlags._M_string_length = 0;
    langFlags.field_2._M_local_buf[0] = '\0';
    if (TVar4 != EXECUTABLE) {
      std::__cxx11::string::append((char *)&langFlags);
      vars.LanguageCompileFlags = langFlags._M_dataplus._M_p;
    }
    launcher._M_dataplus._M_p = (pointer)&launcher.field_2;
    launcher._M_string_length = 0;
    launcher.field_2._M_local_buf[0] = '\0';
    target = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    pcVar1 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
    _comment = (pointer)local_438;
    std::__cxx11::string::_M_construct<char_const*>((string *)&comment,"RULE_LAUNCH_LINK","");
    pcVar7 = cmLocalGenerator::GetRuleLauncher((cmLocalGenerator *)pcVar1,target,(string *)&comment)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_comment != local_438) {
      operator_delete(_comment,CONCAT71(local_438[0]._M_allocated_capacity._1_7_,
                                        local_438[0]._M_local_buf[0]) + 1);
    }
    sVar2 = launcher._M_string_length;
    if ((pcVar7 != (char *)0x0) && (*pcVar7 != '\0')) {
      strlen(pcVar7);
      std::__cxx11::string::_M_replace((ulong)&launcher,0,(char *)sVar2,(ulong)pcVar7);
      std::__cxx11::string::append((char *)&launcher);
    }
    rulePlaceholderExpander._M_t.
    super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
    .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl._0_4_ =
         (*(((this->super_cmNinjaTargetGenerator).LocalGenerator)->super_cmLocalCommonGenerator).
           super_cmLocalGenerator._vptr_cmLocalGenerator[5])();
    rulePlaceholderExpander._M_t.
    super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
    .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl._4_4_ = extraout_var;
    ComputeDeviceLinkCmd_abi_cxx11_(&linkCmds,this);
    if (linkCmds.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        linkCmds.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      __rhs = linkCmds.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
      do {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment
                       ,&launcher,__rhs);
        std::__cxx11::string::operator=((string *)__rhs,(string *)&comment);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_comment != local_438) {
          operator_delete(_comment,CONCAT71(local_438[0]._M_allocated_capacity._1_7_,
                                            local_438[0]._M_local_buf[0]) + 1);
        }
        pcVar1 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
        outputConverter =
             &(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
        if (pcVar1 == (cmLocalNinjaGenerator *)0x0) {
          outputConverter = (cmOutputConverter *)0x0;
        }
        cmRulePlaceholderExpander::ExpandRuleVariables
                  ((cmRulePlaceholderExpander *)
                   rulePlaceholderExpander._M_t.
                   super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
                   .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl,
                   outputConverter,__rhs,&vars);
        __rhs = __rhs + 1;
      } while (__rhs != linkCmds.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
    }
    cmEraseIf<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,cmNinjaRemoveNoOpCommands>
              (&linkCmds);
    local_438[0]._M_local_buf[0] = '\0';
    _comment = (pointer)local_438;
    cmLocalNinjaGenerator::BuildCommandLine
              (&linkCmd,(this->super_cmNinjaTargetGenerator).LocalGenerator,&linkCmds,
               (string *)&comment,(cmGeneratorTarget *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_comment != local_438) {
      operator_delete(_comment,CONCAT71(local_438[0]._M_allocated_capacity._1_7_,
                                        local_438[0]._M_local_buf[0]) + 1);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&comment);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&comment,"Rule for linking ",0x11)
    ;
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&comment,(this->TargetLinkLanguage)._M_dataplus._M_p,
                        (this->TargetLinkLanguage)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
    pcVar7 = GetVisibleTypeName(this);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar8 + (int)poVar8->_vptr_basic_ostream[-3]);
    }
    else {
      sVar9 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar7,sVar9);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,".",1);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&description);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&description,"Linking ",8);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&description,(this->TargetLinkLanguage)._M_dataplus._M_p,
                        (this->TargetLinkLanguage)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
    pcVar7 = GetVisibleTypeName(this);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar8 + (int)poVar8->_vptr_basic_ostream[-3]);
    }
    else {
      sVar9 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar7,sVar9);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," $TARGET_FILE",0xd);
    pcVar5 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringbuf::str();
    local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_528,"");
    local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c8,"");
    local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e8,"$RESTAT","");
    cmGlobalNinjaGenerator::AddRule
              (pcVar5,&ruleName,&linkCmd,&local_488,&local_4a8,&local_528,&local_4c8,&rspfile,
               &rspcontent,&local_4e8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
      operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
      operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_528._M_dataplus._M_p != &local_528.field_2) {
      operator_delete(local_528._M_dataplus._M_p,local_528.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
      operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_488._M_dataplus._M_p != &local_488.field_2) {
      operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&description);
    std::ios_base::~ios_base(local_138);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&comment);
    std::ios_base::~ios_base(local_3d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)linkCmd._M_dataplus._M_p != &linkCmd.field_2) {
      operator_delete(linkCmd._M_dataplus._M_p,linkCmd.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&linkCmds);
    if ((__uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
        )rulePlaceholderExpander._M_t.
         super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
         ._M_t.
         super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
         .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
        )0x0) {
      std::default_delete<cmRulePlaceholderExpander>::operator()
                ((default_delete<cmRulePlaceholderExpander> *)&rulePlaceholderExpander,
                 (cmRulePlaceholderExpander *)
                 rulePlaceholderExpander._M_t.
                 super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
                 .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)launcher._M_dataplus._M_p != &launcher.field_2) {
      operator_delete(launcher._M_dataplus._M_p,
                      CONCAT71(launcher.field_2._M_allocated_capacity._1_7_,
                               launcher.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)langFlags._M_dataplus._M_p != &langFlags.field_2) {
      operator_delete(langFlags._M_dataplus._M_p,
                      CONCAT71(langFlags.field_2._M_allocated_capacity._1_7_,
                               langFlags.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)responseFlag._M_dataplus._M_p != &responseFlag.field_2) {
      operator_delete(responseFlag._M_dataplus._M_p,
                      CONCAT71(responseFlag.field_2._M_allocated_capacity._1_7_,
                               responseFlag.field_2._M_local_buf[0]) + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rspcontent._M_dataplus._M_p != &rspcontent.field_2) {
    operator_delete(rspcontent._M_dataplus._M_p,
                    CONCAT71(rspcontent.field_2._M_allocated_capacity._1_7_,
                             rspcontent.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rspfile._M_dataplus._M_p != &rspfile.field_2) {
    operator_delete(rspfile._M_dataplus._M_p,
                    CONCAT71(rspfile.field_2._M_allocated_capacity._1_7_,
                             rspfile.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ruleName._M_dataplus._M_p != &ruleName.field_2) {
    operator_delete(ruleName._M_dataplus._M_p,ruleName.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteDeviceLinkRule(bool useResponseFile)
{
  cmStateEnums::TargetType targetType = this->GetGeneratorTarget()->GetType();
  std::string ruleName = this->LanguageLinkerDeviceRule();
  // Select whether to use a response file for objects.
  std::string rspfile;
  std::string rspcontent;

  if (!this->GetGlobalGenerator()->HasRule(ruleName)) {
    cmRulePlaceholderExpander::RuleVariables vars;
    vars.CMTargetName = this->GetGeneratorTarget()->GetName().c_str();
    vars.CMTargetType =
      cmState::GetTargetTypeName(this->GetGeneratorTarget()->GetType());

    vars.Language = "CUDA";

    std::string responseFlag;
    if (!useResponseFile) {
      vars.Objects = "$in";
      vars.LinkLibraries = "$LINK_PATH $LINK_LIBRARIES";
    } else {
      std::string cmakeVarLang = "CMAKE_";
      cmakeVarLang += this->TargetLinkLanguage;

      // build response file name
      std::string cmakeLinkVar = cmakeVarLang + "_RESPONSE_FILE_LINK_FLAG";
      const char* flag = GetMakefile()->GetDefinition(cmakeLinkVar);
      if (flag) {
        responseFlag = flag;
      } else {
        responseFlag = "@";
      }
      rspfile = "$RSP_FILE";
      responseFlag += rspfile;

      // build response file content
      if (this->GetGlobalGenerator()->IsGCCOnWindows()) {
        rspcontent = "$in";
      } else {
        rspcontent = "$in_newline";
      }
      rspcontent += " $LINK_LIBRARIES";
      vars.Objects = responseFlag.c_str();
      vars.LinkLibraries = "";
    }

    vars.ObjectDir = "$OBJECT_DIR";

    vars.Target = "$TARGET_FILE";

    vars.SONameFlag = "$SONAME_FLAG";
    vars.TargetSOName = "$SONAME";
    vars.TargetPDB = "$TARGET_PDB";
    vars.TargetCompilePDB = "$TARGET_COMPILE_PDB";

    vars.Flags = "$FLAGS";
    vars.LinkFlags = "$LINK_FLAGS";
    vars.Manifests = "$MANIFESTS";

    std::string langFlags;
    if (targetType != cmStateEnums::EXECUTABLE) {
      langFlags += "$LANGUAGE_COMPILE_FLAGS $ARCH_FLAGS";
      vars.LanguageCompileFlags = langFlags.c_str();
    }

    std::string launcher;
    const char* val = this->GetLocalGenerator()->GetRuleLauncher(
      this->GetGeneratorTarget(), "RULE_LAUNCH_LINK");
    if (val && *val) {
      launcher = val;
      launcher += " ";
    }

    std::unique_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander(
      this->GetLocalGenerator()->CreateRulePlaceholderExpander());

    // Rule for linking library/executable.
    std::vector<std::string> linkCmds = this->ComputeDeviceLinkCmd();
    for (std::string& linkCmd : linkCmds) {
      linkCmd = launcher + linkCmd;
      rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(),
                                                   linkCmd, vars);
    }

    // If there is no ranlib the command will be ":".  Skip it.
    cmEraseIf(linkCmds, cmNinjaRemoveNoOpCommands());

    std::string linkCmd =
      this->GetLocalGenerator()->BuildCommandLine(linkCmds);

    // Write the linker rule with response file if needed.
    std::ostringstream comment;
    comment << "Rule for linking " << this->TargetLinkLanguage << " "
            << this->GetVisibleTypeName() << ".";
    std::ostringstream description;
    description << "Linking " << this->TargetLinkLanguage << " "
                << this->GetVisibleTypeName() << " $TARGET_FILE";
    this->GetGlobalGenerator()->AddRule(ruleName, linkCmd, description.str(),
                                        comment.str(),
                                        /*depfile*/ "",
                                        /*deptype*/ "", rspfile, rspcontent,
                                        /*restat*/ "$RESTAT",
                                        /*generator*/ false);
  }
}